

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

ON_wString __thiscall ON_wString::DecodeXMLValue(ON_wString *this)

{
  int iVar1;
  ON_Internal_Empty_wString *pOVar2;
  wchar_t *pwVar3;
  ON_wString *pOVar4;
  ON_wString *pOVar5;
  long lVar6;
  ON_wString *in_RSI;
  long lVar7;
  ON_wString *pOVar8;
  ON_wString *buffer;
  wchar_t wVar9;
  ON_wString s;
  uint u;
  ON_wString *local_60;
  wchar_t w [8];
  
  pOVar5 = (ON_wString *)in_RSI->m_s;
  pOVar2 = (ON_Internal_Empty_wString *)((long)&pOVar5[-2].m_s + 4);
  if (pOVar5 == (ON_wString *)0x0) {
    pOVar2 = &empty_wstring;
  }
  iVar1 = (pOVar2->header).string_length;
  lVar7 = (long)iVar1;
  if (((lVar7 < 1) || (pOVar5 == (ON_wString *)0x0)) || ((pOVar2->header).string_capacity < 1)) {
    local_60 = &EmptyString;
  }
  else {
    pOVar8 = (ON_wString *)((long)&pOVar5->m_s + lVar7 * 4);
    lVar6 = 0;
    local_60 = in_RSI;
    for (buffer = pOVar5; buffer < pOVar8; buffer = (ON_wString *)((long)&buffer->m_s + 4)) {
      if ((*(int *)&buffer->m_s == 0x26) &&
         (pwVar3 = ParseXMLCharacterEncoding
                             ((wchar_t *)buffer,(int)((ulong)(lVar7 * 4 + lVar6) >> 2),0,(uint *)0x0
                             ), pwVar3 != (wchar_t *)0x0)) {
        Duplicate(&s);
        pOVar2 = (ON_Internal_Empty_wString *)(s.m_s + -3);
        if (s.m_s == (wchar_t *)0x0) {
          pOVar2 = &empty_wstring;
        }
        if ((pOVar2->header).string_length != iVar1) {
          ON_wString(this,&EmptyString);
          goto LAB_0066ffe4;
        }
        pOVar4 = (ON_wString *)Array(&s);
        if (pOVar4 != pOVar5) {
          pwVar3 = (wchar_t *)((long)pOVar4 - lVar6);
          local_60 = pOVar4;
          goto LAB_0066fef9;
        }
        ON_wString(this,&EmptyString);
        goto LAB_0066ffe4;
      }
      lVar6 = lVar6 + -4;
    }
  }
  ON_wString(this,local_60);
  return (ON_wString)this;
LAB_0066fef9:
  if (pOVar8 <= buffer) {
    SetLength(&s,(long)pwVar3 - (long)local_60 >> 2);
    ON_wString(this,&s);
LAB_0066ffe4:
    ~ON_wString(&s);
    return (ON_wString)this;
  }
  wVar9 = *(wchar_t *)&buffer->m_s;
  if (wVar9 == L'&') {
    u = 0x110000;
    pOVar5 = (ON_wString *)
             ParseXMLCharacterEncoding
                       ((wchar_t *)buffer,(int)((ulong)((long)pOVar8 - (long)buffer) >> 2),0x110000,
                        &u);
    if (pOVar5 <= buffer) goto LAB_0066ff86;
    w[4] = L'\0';
    w[5] = L'\0';
    w[6] = L'\0';
    w[7] = L'\0';
    w[0] = L'\0';
    w[1] = L'\0';
    w[2] = L'\0';
    w[3] = L'\0';
    iVar1 = ON_EncodeWideChar(u,8,w);
    buffer = pOVar5;
    if (iVar1 < 1) goto LAB_0066ff86;
    for (lVar7 = 0; (ulong)(iVar1 - 1) * 4 - lVar7 != 0; lVar7 = lVar7 + 4) {
      *(undefined4 *)((long)pwVar3 + lVar7) = *(undefined4 *)((long)w + lVar7);
    }
    wVar9 = w[iVar1 - 1];
    pwVar3 = (wchar_t *)((long)pwVar3 + lVar7);
  }
  else {
LAB_0066ff86:
    pOVar5 = (ON_wString *)((long)&buffer->m_s + 4);
  }
  *pwVar3 = wVar9;
  pwVar3 = pwVar3 + 1;
  buffer = pOVar5;
  goto LAB_0066fef9;
}

Assistant:

const ON_wString ON_wString::DecodeXMLValue() const
{
  const int length0 = this->Length();
  if (length0 <= 0)
    return ON_wString::EmptyString;

  const wchar_t* buffer0 = this->Array();
  if (nullptr == buffer0)
    return ON_wString::EmptyString;

  const wchar_t* buffer0_end = buffer0 + length0;
  for (const wchar_t* buffer1 = buffer0; buffer1 < buffer0_end; ++buffer1)
  {
    if (ON_wString::Ampersand != *buffer1)
      continue;
    if (nullptr == ON_wString::ParseXMLCharacterEncoding(buffer1, (int)(buffer0_end - buffer1), 0, nullptr))
      continue;

    // need to copy and modify.
    ON_wString s = this->Duplicate();
    if (s.Length() != length0)
      return ON_wString::EmptyString; // catastrophe!
    wchar_t* b0 = s.Array();
    if ( b0 == buffer0)
      return ON_wString::EmptyString; // catastrophe!

    // skip what we've already parsed
    wchar_t* b1 = b0 + (buffer1 - buffer0);

    // continue parsing and copying parsed results to s.
    for (wchar_t c = 0; buffer1 < buffer0_end; *b1++ = c)
    {
      c = *buffer1;
      if (ON_wString::Ampersand == c)
      {
        unsigned u = ON_UnicodeCodePoint::ON_InvalidCodePoint;
        const wchar_t* buffer2 = ON_wString::ParseXMLCharacterEncoding(buffer1, (int)(buffer0_end - buffer1), u, &u);
        if (buffer2 > buffer1)
        {
          buffer1 = buffer2;
          wchar_t w[8] = {};
          const int wcount = ON_EncodeWideChar(u, sizeof(w) / sizeof(w[0]), w);
          if (wcount >= 1)
          {
            for (int i = 0; i + 1 < wcount; ++i)
              *b1++ = w[i]; // UTF-16 or UTF-8 encoding
            c = w[wcount - 1];
            continue;
          }
        }
      }
      ++buffer1;
    }

    // s is the decoded version of this.
    s.SetLength(b1 - b0);
    return s;
  }

  // nothing to decode
  return *this;
}